

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForVersion::~CallForVersion(CallForVersion *this)

{
  CallForVersion *this_local;
  
  ~CallForVersion(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

CallForVersion()
        : CallForVersion("This should be caught in your main function, see examples", ExitCodes::Success) {}